

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

unique_ptr<Catch::Detail::(anonymous_namespace)::CoutStream>
Catch::Detail::make_unique<Catch::Detail::(anonymous_namespace)::CoutStream>(void)

{
  _func_int **pp_Var1;
  CoutStream *in_RDI;
  
  pp_Var1 = (_func_int **)operator_new(0x118);
  *pp_Var1 = (_func_int *)&PTR__CoutStream_001a7040;
  std::ostream::ostream
            (pp_Var1 + 1,
             *(streambuf **)
              (&__cxxabiv1::__function_type_info::vtable + *(long *)(std::cout + -0x18)));
  (in_RDI->super_IStream)._vptr_IStream = pp_Var1;
  return (unique_ptr<Catch::Detail::(anonymous_namespace)::CoutStream>)in_RDI;
}

Assistant:

unique_ptr<T> make_unique(Args&&... args) {
        return unique_ptr<T>(new T(CATCH_FORWARD(args)...));
    }